

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O2

int bssl::SSL_SESSION_to_bytes_full(SSL_SESSION *in,CBB *cbb,int for_ticket)

{
  OPENSSL_STACK *sk;
  byte bVar1;
  int iVar2;
  size_t sVar3;
  CRYPTO_BUFFER *pCVar4;
  uint8_t *puVar5;
  size_t data_len;
  size_t i;
  ulong i_00;
  CBB child;
  CBB session;
  CBB child2;
  
  if (in == (SSL_SESSION *)0x0) {
    return 0;
  }
  if (in->cipher == (SSL_CIPHER *)0x0) {
    return 0;
  }
  iVar2 = CBB_add_asn1(cbb,&session,0x20000010);
  if (iVar2 == 0) {
    return 0;
  }
  i_00 = 1;
  iVar2 = CBB_add_asn1_uint64(&session,1);
  if (iVar2 == 0) {
    return 0;
  }
  iVar2 = CBB_add_asn1_uint64(&session,(ulong)in->ssl_version);
  if (iVar2 == 0) {
    return 0;
  }
  iVar2 = CBB_add_asn1(&session,&child,4);
  if (iVar2 == 0) {
    return 0;
  }
  iVar2 = CBB_add_u16(&child,(uint16_t)in->cipher->id);
  if (iVar2 == 0) {
    return 0;
  }
  sVar3 = 0;
  if (for_ticket == 0) {
    sVar3 = (size_t)(in->session_id).size_;
  }
  iVar2 = CBB_add_asn1_octet_string(&session,(uint8_t *)&in->session_id,sVar3);
  if (((((iVar2 != 0) &&
        (iVar2 = CBB_add_asn1_octet_string
                           (&session,(uint8_t *)&in->secret,(ulong)(in->secret).size_), iVar2 != 0))
       && (iVar2 = CBB_add_asn1(&session,&child,0xa0000001), iVar2 != 0)) &&
      ((iVar2 = CBB_add_asn1_uint64(&child,in->time), iVar2 != 0 &&
       (iVar2 = CBB_add_asn1(&session,&child,0xa0000002), iVar2 != 0)))) &&
     (iVar2 = CBB_add_asn1_uint64(&child,(ulong)in->timeout), iVar2 != 0)) {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)
                           (in->certs)._M_t.
                           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
                           _M_t.
                           super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl);
    if ((sVar3 != 0) && ((in->field_0x1b8 & 2) == 0)) {
      pCVar4 = (CRYPTO_BUFFER *)
               OPENSSL_sk_value((OPENSSL_STACK *)
                                (in->certs)._M_t.
                                super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl
                                ,0);
      puVar5 = CRYPTO_BUFFER_data(pCVar4);
      sVar3 = CRYPTO_BUFFER_len(pCVar4);
      iVar2 = CBB_add_asn1_element(&session,0xa0000003,puVar5,sVar3);
      if (iVar2 == 0) {
        return 0;
      }
    }
    iVar2 = CBB_add_asn1(&session,&child,0xa0000004);
    if (((iVar2 != 0) &&
        (iVar2 = CBB_add_asn1_octet_string
                           (&child,(uint8_t *)&in->sid_ctx,(ulong)(in->sid_ctx).size_), iVar2 != 0))
       && ((in->verify_result == 0 ||
           ((iVar2 = CBB_add_asn1(&session,&child,0xa0000005), iVar2 != 0 &&
            (iVar2 = CBB_add_asn1_uint64(&child,in->verify_result), iVar2 != 0)))))) {
      if ((in->psk_identity)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) {
        iVar2 = CBB_add_asn1(&session,&child,0xa0000008);
        if (iVar2 == 0) {
          return 0;
        }
        puVar5 = (uint8_t *)
                 (in->psk_identity)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        data_len = strlen((char *)puVar5);
        iVar2 = CBB_add_asn1_octet_string(&child,puVar5,data_len);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if (((((in->ticket_lifetime_hint == 0) ||
            ((iVar2 = CBB_add_asn1(&session,&child,0xa0000009), iVar2 != 0 &&
             (iVar2 = CBB_add_asn1_uint64(&child,(ulong)in->ticket_lifetime_hint), iVar2 != 0)))) &&
           ((for_ticket != 0 ||
            (((in->ticket).size_ == 0 ||
             ((iVar2 = CBB_add_asn1(&session,&child,0xa000000a), iVar2 != 0 &&
              (iVar2 = CBB_add_asn1_octet_string(&child,(in->ticket).data_,(in->ticket).size_),
              iVar2 != 0)))))))) &&
          (((in->field_0x1b8 & 2) == 0 ||
           ((iVar2 = CBB_add_asn1(&session,&child,0xa000000d), iVar2 != 0 &&
            (iVar2 = CBB_add_asn1_octet_string(&child,in->peer_sha256,0x20), iVar2 != 0)))))) &&
         (((in->original_handshake_hash).size_ == '\0' ||
          ((iVar2 = CBB_add_asn1(&session,&child,0xa000000e), iVar2 != 0 &&
           (iVar2 = CBB_add_asn1_octet_string
                              (&child,(uint8_t *)&in->original_handshake_hash,
                               (ulong)(in->original_handshake_hash).size_), iVar2 != 0)))))) {
        if ((in->signed_cert_timestamp_list)._M_t.
            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl != (crypto_buffer_st *)0x0
           ) {
          iVar2 = CBB_add_asn1(&session,&child,0xa000000f);
          if (iVar2 == 0) {
            return 0;
          }
          puVar5 = CRYPTO_BUFFER_data((in->signed_cert_timestamp_list)._M_t.
                                      super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl
                                     );
          sVar3 = CRYPTO_BUFFER_len((in->signed_cert_timestamp_list)._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
          iVar2 = CBB_add_asn1_octet_string(&child,puVar5,sVar3);
          if (iVar2 == 0) {
            return 0;
          }
        }
        if ((in->ocsp_response)._M_t.
            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl != (crypto_buffer_st *)0x0
           ) {
          iVar2 = CBB_add_asn1(&session,&child,0xa0000010);
          if (iVar2 == 0) {
            return 0;
          }
          puVar5 = CRYPTO_BUFFER_data((in->ocsp_response)._M_t.
                                      super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl
                                     );
          sVar3 = CRYPTO_BUFFER_len((in->ocsp_response)._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
          iVar2 = CBB_add_asn1_octet_string(&child,puVar5,sVar3);
          if (iVar2 == 0) {
            return 0;
          }
        }
        if ((((in->field_0x1b8 & 1) == 0) ||
            ((iVar2 = CBB_add_asn1(&session,&child,0xa0000011), iVar2 != 0 &&
             (iVar2 = CBB_add_asn1_bool(&child,1), iVar2 != 0)))) &&
           ((in->group_id == 0 ||
            ((iVar2 = CBB_add_asn1(&session,&child,0xa0000012), iVar2 != 0 &&
             (iVar2 = CBB_add_asn1_uint64(&child,(ulong)in->group_id), iVar2 != 0)))))) {
          sk = (OPENSSL_STACK *)
               (in->certs)._M_t.
               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
          if ((sk == (OPENSSL_STACK *)0x0) ||
             (((in->field_0x1b8 & 2) != 0 || (sVar3 = OPENSSL_sk_num(sk), sVar3 < 2)))) {
LAB_001479a0:
            bVar1 = in->field_0x1b8;
            if ((bVar1 & 8) != 0) {
              iVar2 = CBB_add_asn1(&session,&child,0xa0000015);
              if (iVar2 == 0) {
                return 0;
              }
              iVar2 = CBB_add_asn1(&child,&child2,4);
              if (iVar2 == 0) {
                return 0;
              }
              iVar2 = CBB_add_u32(&child2,in->ticket_age_add);
              if (iVar2 == 0) {
                return 0;
              }
              bVar1 = in->field_0x1b8;
            }
            if ((bVar1 & 0x10) == 0) {
              iVar2 = CBB_add_asn1(&session,&child,0xa0000016);
              if (iVar2 == 0) {
                return 0;
              }
              iVar2 = CBB_add_asn1_bool(&child,0);
              if (iVar2 == 0) {
                return 0;
              }
            }
            if ((((((in->peer_signature_algorithm == 0) ||
                   ((iVar2 = CBB_add_asn1(&session,&child,0xa0000017), iVar2 != 0 &&
                    (iVar2 = CBB_add_asn1_uint64(&child,(ulong)in->peer_signature_algorithm),
                    iVar2 != 0)))) &&
                  ((in->ticket_max_early_data == 0 ||
                   ((iVar2 = CBB_add_asn1(&session,&child,0xa0000018), iVar2 != 0 &&
                    (iVar2 = CBB_add_asn1_uint64(&child,(ulong)in->ticket_max_early_data),
                    iVar2 != 0)))))) &&
                 ((in->timeout == in->auth_timeout ||
                  ((iVar2 = CBB_add_asn1(&session,&child,0xa0000019), iVar2 != 0 &&
                   (iVar2 = CBB_add_asn1_uint64(&child,(ulong)in->auth_timeout), iVar2 != 0)))))) &&
                (((in->early_alpn).size_ == 0 ||
                 ((iVar2 = CBB_add_asn1(&session,&child,0xa000001a), iVar2 != 0 &&
                  (iVar2 = CBB_add_asn1_octet_string
                                     (&child,(in->early_alpn).data_,(in->early_alpn).size_),
                  iVar2 != 0)))))) &&
               ((((in->field_0x1b8 & 0x20) == 0 ||
                 ((iVar2 = CBB_add_asn1(&session,&child,0xa000001b), iVar2 != 0 &&
                  (iVar2 = CBB_add_asn1_bool(&child,1), iVar2 != 0)))) &&
                (((in->quic_early_data_context).size_ == 0 ||
                 ((iVar2 = CBB_add_asn1(&session,&child,0xa000001c), iVar2 != 0 &&
                  (iVar2 = CBB_add_asn1_octet_string
                                     (&child,(in->quic_early_data_context).data_,
                                      (in->quic_early_data_context).size_), iVar2 != 0)))))))) {
              bVar1 = in->field_0x1b8;
              if ((bVar1 & 0x40) != 0) {
                iVar2 = CBB_add_asn1(&session,&child,0xa000001d);
                if (iVar2 == 0) {
                  return 0;
                }
                iVar2 = CBB_add_asn1_octet_string
                                  (&child,(in->local_application_settings).data_,
                                   (in->local_application_settings).size_);
                if (iVar2 == 0) {
                  return 0;
                }
                iVar2 = CBB_add_asn1(&session,&child,0xa000001e);
                if (iVar2 == 0) {
                  return 0;
                }
                iVar2 = CBB_add_asn1_octet_string
                                  (&child,(in->peer_application_settings).data_,
                                   (in->peer_application_settings).size_);
                if (iVar2 == 0) {
                  return 0;
                }
                bVar1 = in->field_0x1b8;
              }
              if ((char)bVar1 < '\0') {
                iVar2 = CBB_add_asn1(&session,&child,0xa000001f);
                if (iVar2 == 0) {
                  return 0;
                }
                iVar2 = CBB_add_asn1_bool(&child,1);
                if (iVar2 == 0) {
                  return 0;
                }
              }
              iVar2 = CBB_flush(cbb);
              return iVar2;
            }
          }
          else {
            iVar2 = CBB_add_asn1(&session,&child,0xa0000013);
            while (iVar2 != 0) {
              sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)
                                     (in->certs)._M_t.
                                     super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>.
                                     _M_head_impl);
              if (sVar3 <= i_00) goto LAB_001479a0;
              pCVar4 = (CRYPTO_BUFFER *)
                       OPENSSL_sk_value((OPENSSL_STACK *)
                                        (in->certs)._M_t.
                                        super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>.
                                        _M_head_impl,i_00);
              puVar5 = CRYPTO_BUFFER_data(pCVar4);
              sVar3 = CRYPTO_BUFFER_len(pCVar4);
              iVar2 = CBB_add_bytes(&child,puVar5,sVar3);
              i_00 = i_00 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int SSL_SESSION_to_bytes_full(const SSL_SESSION *in, CBB *cbb,
                                     int for_ticket) {
  if (in == NULL || in->cipher == NULL) {
    return 0;
  }

  CBB session, child, child2;
  if (!CBB_add_asn1(cbb, &session, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&session, kVersion) ||
      !CBB_add_asn1_uint64(&session, in->ssl_version) ||
      !CBB_add_asn1(&session, &child, CBS_ASN1_OCTETSTRING) ||
      !CBB_add_u16(&child, (uint16_t)(in->cipher->id & 0xffff)) ||
      // The session ID is irrelevant for a session ticket.
      !CBB_add_asn1_octet_string(&session, in->session_id.data(),
                                 for_ticket ? 0 : in->session_id.size()) ||
      !CBB_add_asn1_octet_string(&session, in->secret.data(),
                                 in->secret.size()) ||
      !CBB_add_asn1(&session, &child, kTimeTag) ||
      !CBB_add_asn1_uint64(&child, in->time) ||
      !CBB_add_asn1(&session, &child, kTimeoutTag) ||
      !CBB_add_asn1_uint64(&child, in->timeout)) {
    return 0;
  }

  // The peer certificate is only serialized if the SHA-256 isn't
  // serialized instead.
  if (sk_CRYPTO_BUFFER_num(in->certs.get()) > 0 && !in->peer_sha256_valid) {
    const CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(in->certs.get(), 0);
    if (!CBB_add_asn1_element(&session, kPeerTag, CRYPTO_BUFFER_data(buffer),
                              CRYPTO_BUFFER_len(buffer))) {
      return 0;
    }
  }

  // Although it is OPTIONAL and usually empty, OpenSSL has
  // historically always encoded the sid_ctx.
  if (!CBB_add_asn1(&session, &child, kSessionIDContextTag) ||
      !CBB_add_asn1_octet_string(&child, in->sid_ctx.data(),
                                 in->sid_ctx.size())) {
    return 0;
  }

  if (in->verify_result != X509_V_OK) {
    if (!CBB_add_asn1(&session, &child, kVerifyResultTag) ||
        !CBB_add_asn1_uint64(&child, in->verify_result)) {
      return 0;
    }
  }

  if (in->psk_identity) {
    if (!CBB_add_asn1(&session, &child, kPSKIdentityTag) ||
        !CBB_add_asn1_octet_string(&child,
                                   (const uint8_t *)in->psk_identity.get(),
                                   strlen(in->psk_identity.get()))) {
      return 0;
    }
  }

  if (in->ticket_lifetime_hint > 0) {
    if (!CBB_add_asn1(&session, &child, kTicketLifetimeHintTag) ||
        !CBB_add_asn1_uint64(&child, in->ticket_lifetime_hint)) {
      return 0;
    }
  }

  if (!in->ticket.empty() && !for_ticket) {
    if (!CBB_add_asn1(&session, &child, kTicketTag) ||
        !CBB_add_asn1_octet_string(&child, in->ticket.data(),
                                   in->ticket.size())) {
      return 0;
    }
  }

  if (in->peer_sha256_valid) {
    if (!CBB_add_asn1(&session, &child, kPeerSHA256Tag) ||
        !CBB_add_asn1_octet_string(&child, in->peer_sha256,
                                   sizeof(in->peer_sha256))) {
      return 0;
    }
  }

  if (!in->original_handshake_hash.empty()) {
    if (!CBB_add_asn1(&session, &child, kOriginalHandshakeHashTag) ||
        !CBB_add_asn1_octet_string(&child, in->original_handshake_hash.data(),
                                   in->original_handshake_hash.size())) {
      return 0;
    }
  }

  if (in->signed_cert_timestamp_list != nullptr) {
    if (!CBB_add_asn1(&session, &child, kSignedCertTimestampListTag) ||
        !CBB_add_asn1_octet_string(
            &child, CRYPTO_BUFFER_data(in->signed_cert_timestamp_list.get()),
            CRYPTO_BUFFER_len(in->signed_cert_timestamp_list.get()))) {
      return 0;
    }
  }

  if (in->ocsp_response != nullptr) {
    if (!CBB_add_asn1(&session, &child, kOCSPResponseTag) ||
        !CBB_add_asn1_octet_string(
            &child, CRYPTO_BUFFER_data(in->ocsp_response.get()),
            CRYPTO_BUFFER_len(in->ocsp_response.get()))) {
      return 0;
    }
  }

  if (in->extended_master_secret) {
    if (!CBB_add_asn1(&session, &child, kExtendedMasterSecretTag) ||
        !CBB_add_asn1_bool(&child, true)) {
      return 0;
    }
  }

  if (in->group_id > 0 &&                               //
      (!CBB_add_asn1(&session, &child, kGroupIDTag) ||  //
       !CBB_add_asn1_uint64(&child, in->group_id))) {
    return 0;
  }

  // The certificate chain is only serialized if the leaf's SHA-256 isn't
  // serialized instead.
  if (in->certs != NULL &&       //
      !in->peer_sha256_valid &&  //
      sk_CRYPTO_BUFFER_num(in->certs.get()) >= 2) {
    if (!CBB_add_asn1(&session, &child, kCertChainTag)) {
      return 0;
    }
    for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(in->certs.get()); i++) {
      const CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(in->certs.get(), i);
      if (!CBB_add_bytes(&child, CRYPTO_BUFFER_data(buffer),
                         CRYPTO_BUFFER_len(buffer))) {
        return 0;
      }
    }
  }

  if (in->ticket_age_add_valid) {
    if (!CBB_add_asn1(&session, &child, kTicketAgeAddTag) ||
        !CBB_add_asn1(&child, &child2, CBS_ASN1_OCTETSTRING) ||
        !CBB_add_u32(&child2, in->ticket_age_add)) {
      return 0;
    }
  }

  if (!in->is_server) {
    if (!CBB_add_asn1(&session, &child, kIsServerTag) ||
        !CBB_add_asn1_bool(&child, false)) {
      return 0;
    }
  }

  if (in->peer_signature_algorithm != 0 &&
      (!CBB_add_asn1(&session, &child, kPeerSignatureAlgorithmTag) ||
       !CBB_add_asn1_uint64(&child, in->peer_signature_algorithm))) {
    return 0;
  }

  if (in->ticket_max_early_data != 0 &&
      (!CBB_add_asn1(&session, &child, kTicketMaxEarlyDataTag) ||
       !CBB_add_asn1_uint64(&child, in->ticket_max_early_data))) {
    return 0;
  }

  if (in->timeout != in->auth_timeout &&
      (!CBB_add_asn1(&session, &child, kAuthTimeoutTag) ||
       !CBB_add_asn1_uint64(&child, in->auth_timeout))) {
    return 0;
  }

  if (!in->early_alpn.empty()) {
    if (!CBB_add_asn1(&session, &child, kEarlyALPNTag) ||
        !CBB_add_asn1_octet_string(&child, in->early_alpn.data(),
                                   in->early_alpn.size())) {
      return 0;
    }
  }

  if (in->is_quic) {
    if (!CBB_add_asn1(&session, &child, kIsQuicTag) ||
        !CBB_add_asn1_bool(&child, true)) {
      return 0;
    }
  }

  if (!in->quic_early_data_context.empty()) {
    if (!CBB_add_asn1(&session, &child, kQuicEarlyDataContextTag) ||
        !CBB_add_asn1_octet_string(&child, in->quic_early_data_context.data(),
                                   in->quic_early_data_context.size())) {
      return 0;
    }
  }

  if (in->has_application_settings) {
    if (!CBB_add_asn1(&session, &child, kLocalALPSTag) ||
        !CBB_add_asn1_octet_string(&child,
                                   in->local_application_settings.data(),
                                   in->local_application_settings.size()) ||
        !CBB_add_asn1(&session, &child, kPeerALPSTag) ||
        !CBB_add_asn1_octet_string(&child, in->peer_application_settings.data(),
                                   in->peer_application_settings.size())) {
      return 0;
    }
  }

  if (in->is_resumable_across_names) {
    if (!CBB_add_asn1(&session, &child, kResumableAcrossNamesTag) ||
        !CBB_add_asn1_bool(&child, true)) {
      return 0;
    }
  }

  return CBB_flush(cbb);
}